

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O0

void __thiscall DIS::RecordSpecification::marshal(RecordSpecification *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_38 [8];
  RecordSpecificationElement x;
  size_t idx;
  DataStream *dataStream_local;
  RecordSpecification *this_local;
  
  sVar2 = std::
          vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
          ::size(&this->_recordSets);
  DataStream::operator<<(dataStream,(uint)sVar2);
  x._recordLength = 0;
  x._recordCount = 0;
  x._recordValues = 0;
  x._pad4 = '\0';
  x._23_1_ = 0;
  while( true ) {
    uVar1 = x._16_8_;
    sVar2 = std::
            vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
            ::size(&this->_recordSets);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::
             vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
             ::operator[](&this->_recordSets,x._16_8_);
    RecordSpecificationElement::RecordSpecificationElement
              ((RecordSpecificationElement *)local_38,pvVar3);
    RecordSpecificationElement::marshal((RecordSpecificationElement *)local_38,dataStream);
    RecordSpecificationElement::~RecordSpecificationElement((RecordSpecificationElement *)local_38);
    x._16_8_ = x._16_8_ + 1;
  }
  return;
}

Assistant:

void RecordSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned int )_recordSets.size();

     for(size_t idx = 0; idx < _recordSets.size(); idx++)
     {
        RecordSpecificationElement x = _recordSets[idx];
        x.marshal(dataStream);
     }

}